

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_sequence_containers.h
# Opt level: O0

output_type *
testinator::Arbitrary<std::__cxx11::list<int,_std::allocator<int>_>_>::generate
          (output_type *__return_storage_ptr__,size_t generation,unsigned_long randomSeed)

{
  anon_class_16_2_2856ea55 __gen;
  back_insert_iterator<std::__cxx11::list<int,_std::allocator<int>_>_> __first;
  ulong uVar1;
  size_t n;
  unsigned_long local_20;
  unsigned_long randomSeed_local;
  size_t generation_local;
  output_type *v;
  
  local_20 = randomSeed;
  randomSeed_local = generation;
  generation_local = (size_t)__return_storage_ptr__;
  ::std::__cxx11::list<int,_std::allocator<int>_>::list(__return_storage_ptr__);
  if (randomSeed_local != 0) {
    uVar1 = randomSeed_local / 100;
    __first = ::std::back_inserter<std::__cxx11::list<int,std::allocator<int>>>
                        (__return_storage_ptr__);
    __gen.randomSeed = &local_20;
    __gen.generation = &randomSeed_local;
    ::std::
    generate_n<std::back_insert_iterator<std::__cxx11::list<int,std::allocator<int>>>,unsigned_long,testinator::Arbitrary<std::__cxx11::list<int,std::allocator<int>>>::generate(unsigned_long,unsigned_long)::_lambda()_1_>
              (__first,uVar1 * 5 + 5,__gen);
  }
  return __return_storage_ptr__;
}

Assistant:

static output_type generate(std::size_t generation, unsigned long int randomSeed)
    {
      output_type v;
      if (generation == 0) return v;
      std::size_t n = N * ((generation / 100) + 1);
      std::generate_n(std::back_inserter(v), n,
                      [&] () { return Arbitrary<T>::generate(generation++, randomSeed++); });
      return v;
    }